

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_AppStoreReceipt.cpp
# Opt level: O0

bool axl::cry::verifyAppStoreReceipt(AppStoreReceipt *receipt,void *p,size_t size,uint_t flags)

{
  bool bVar1;
  Array<char,_axl::sl::ArrayDetails<char>_> computerGuid;
  uint_t in_stack_00000214;
  size_t in_stack_00000218;
  void *in_stack_00000220;
  size_t in_stack_00000228;
  void *in_stack_00000230;
  AppStoreReceipt *in_stack_00000238;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_38 [2];
  
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x1500fc);
  sl::Array::operator_cast_to_char_((Array *)local_38);
  sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(local_38);
  bVar1 = verifyAppStoreReceipt
                    (in_stack_00000238,in_stack_00000230,in_stack_00000228,in_stack_00000220,
                     in_stack_00000218,in_stack_00000214);
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::~Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x150172);
  return bVar1;
}

Assistant:

bool
verifyAppStoreReceipt(
	AppStoreReceipt* receipt,
	const void* p,
	size_t size,
	uint_t flags
) {
	sl::Array<char> computerGuid;

#if (_AXL_OS_DARWIN)
	if (!(flags & VerifyAppStoreReceiptFlag_SkipSignatureCheck)) {
		size_t result = iok::getComputerGuid(&computerGuid);
		if (result == -1)
			return false;
	}
#endif

	return verifyAppStoreReceipt(receipt, p, size, computerGuid, computerGuid.getCount(), flags);
}